

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

void __thiscall QDataStream::abortTransaction(QDataStream *this)

{
  long lVar1;
  short sVar2;
  QIODevice *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffd8;
  QMessageLogger *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)((long)&in_RDI[1].super_QObject._vptr_QObject + 3) = 2;
  if (*(short *)((long)&in_RDI[1].super_QObject.d_ptr.d + 4) == 0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20),
               (char *)in_RDI);
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffd8,"QDataStream: No transaction in progress")
    ;
  }
  else {
    sVar2 = *(short *)((long)&in_RDI[1].super_QObject.d_ptr.d + 4) + -1;
    *(short *)((long)&in_RDI[1].super_QObject.d_ptr.d + 4) = sVar2;
    if ((sVar2 == 0) && ((in_RDI->super_QObject).d_ptr.d != (QObjectData *)0x0)) {
      QIODevice::commitTransaction(in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDataStream::abortTransaction()
{
    q_status = ReadCorruptData;

    CHECK_STREAM_TRANSACTION_PRECOND(Q_VOID)
    if (--transactionDepth != 0)
        return;

    CHECK_STREAM_PRECOND(Q_VOID)
    dev->commitTransaction();
}